

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

int MMDB_read_node(MMDB_s *mmdb,uint32_t node_number,MMDB_search_node_s *node)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint8_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  undefined4 uStack_6c;
  undefined4 uStack_5c;
  uint8_t *record_pointer;
  uint8_t *search_tree;
  record_info_s record_info;
  MMDB_search_node_s *node_local;
  uint32_t node_number_local;
  MMDB_s *mmdb_local;
  
  record_info._24_8_ = node;
  record_info_for_database((record_info_s *)&search_tree,mmdb);
  if ((byte)record_info.right_record_getter == 0) {
    mmdb_local._4_4_ = 6;
  }
  else if ((mmdb->metadata).node_count < node_number) {
    mmdb_local._4_4_ = 10;
  }
  else {
    puVar1 = mmdb->file_content;
    uVar5 = (*(code *)record_info._0_8_)(puVar1 + node_number * (ushort)search_tree);
    *(ulong *)record_info._24_8_ = (ulong)uVar5;
    uVar6 = (*record_info.left_record_getter)
                      (puVar1 + node_number * (ushort)search_tree +
                       (int)(uint)(byte)record_info.right_record_getter);
    *(ulong *)(record_info._24_8_ + 8) = (ulong)uVar6;
    uVar4 = record_type(mmdb,*(uint64_t *)record_info._24_8_);
    *(uint8_t *)(record_info._24_8_ + 0x10) = uVar4;
    uVar4 = record_type(mmdb,*(uint64_t *)(record_info._24_8_ + 8));
    uVar2 = record_info._24_8_;
    *(uint8_t *)(record_info._24_8_ + 0x11) = uVar4;
    uVar6 = data_section_offset_for_record(mmdb,*(uint64_t *)record_info._24_8_);
    uVar3 = record_info._24_8_;
    *(MMDB_s **)(uVar2 + 0x18) = mmdb;
    *(ulong *)(uVar2 + 0x20) = CONCAT44(uStack_5c,uVar6);
    uVar6 = data_section_offset_for_record(mmdb,*(uint64_t *)(record_info._24_8_ + 8));
    *(MMDB_s **)(uVar3 + 0x28) = mmdb;
    *(ulong *)(uVar3 + 0x30) = CONCAT44(uStack_6c,uVar6);
    mmdb_local._4_4_ = 0;
  }
  return mmdb_local._4_4_;
}

Assistant:

int MMDB_read_node(const MMDB_s *const mmdb,
                   uint32_t node_number,
                   MMDB_search_node_s *const node) {
    record_info_s record_info = record_info_for_database(mmdb);
    if (record_info.right_record_offset == 0) {
        return MMDB_UNKNOWN_DATABASE_FORMAT_ERROR;
    }

    if (node_number > mmdb->metadata.node_count) {
        return MMDB_INVALID_NODE_NUMBER_ERROR;
    }

    const uint8_t *search_tree = mmdb->file_content;
    const uint8_t *record_pointer =
        &search_tree[node_number * record_info.record_length];
    node->left_record = record_info.left_record_getter(record_pointer);
    record_pointer += record_info.right_record_offset;
    node->right_record = record_info.right_record_getter(record_pointer);

    node->left_record_type = record_type(mmdb, node->left_record);
    node->right_record_type = record_type(mmdb, node->right_record);

    // Note that offset will be invalid if the record type is not
    // MMDB_RECORD_TYPE_DATA, but that's ok. Any use of the record entry
    // for other data types is a programming error.
    node->left_record_entry = (struct MMDB_entry_s){
        .mmdb = mmdb,
        .offset = data_section_offset_for_record(mmdb, node->left_record),
    };
    node->right_record_entry = (struct MMDB_entry_s){
        .mmdb = mmdb,
        .offset = data_section_offset_for_record(mmdb, node->right_record),
    };

    return MMDB_SUCCESS;
}